

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O3

int __thiscall String::sprintf(String *this,char *__s,char *__format,...)

{
  char *pcVar1;
  char in_AL;
  int iVar2;
  int extraout_EAX;
  char *__s_00;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  char *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_e8 = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f0 = &va[0].overflow_arg_area;
  local_f8 = 0x3000000010;
  local_c8 = __format;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  do {
    __s_00 = (char *)operator_new__(0x100);
    iVar2 = vsnprintf(__s_00,0x100,__s,&local_f8);
  } while (0xff < iVar2);
  pcVar1 = (char *)(this->_string)._M_string_length;
  strlen(__s_00);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)__s_00);
  operator_delete__(__s_00);
  return extraout_EAX;
}

Assistant:

void String::sprintf (const char* fmtstr, ...)
{
	char* buf;
	int bufsize = 256;
	va_list va;
	va_start (va, fmtstr);

	do
		buf = new char[bufsize];
	while (vsnprintf (buf, bufsize, fmtstr, va) >= bufsize);

	va_end (va);
	_string = buf;
	delete[] buf;
}